

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O0

int remote_send_handle(harbor *h,uint32_t source,uint32_t destination,int type,int session,char *msg
                      ,size_t sz)

{
  skynet_context *ctx;
  uint uVar1;
  slave *psVar2;
  harbor_msg_queue *phVar3;
  undefined4 uVar4;
  undefined1 local_60 [8];
  remote_message_header cookie;
  remote_message_header header;
  slave *s;
  skynet_context *context;
  int harbor_id;
  char *msg_local;
  int session_local;
  int type_local;
  uint32_t destination_local;
  uint32_t source_local;
  harbor *h_local;
  
  uVar1 = destination >> 0x18;
  ctx = h->ctx;
  if (uVar1 == h->id) {
    skynet_send(ctx,source,destination,type | 0x10000,session,msg,sz);
    h_local._4_4_ = 1;
  }
  else {
    psVar2 = h->s + (int)uVar1;
    if ((psVar2->fd == 0) || (psVar2->status == 1)) {
      if (psVar2->status != 4) {
        if (psVar2->queue == (harbor_msg_queue *)0x0) {
          phVar3 = new_queue();
          psVar2->queue = phVar3;
        }
        cookie.session = type << 0x18 | destination & 0xffffff;
        cookie.destination = source;
        push_queue(psVar2->queue,msg,sz,(remote_message_header *)&cookie.destination);
        return 1;
      }
      uVar4 = 0;
      skynet_send(ctx,destination,source,7,0,(void *)0x0,0);
      skynet_error(ctx,"Drop message to harbor %d from %x to %x (session = %d, msgsz = %d)",
                   (ulong)uVar1,(ulong)source,(ulong)destination,(ulong)(uint)session,
                   CONCAT44(uVar4,(int)sz));
    }
    else {
      local_60._4_4_ = destination & 0xffffff | type << 0x18;
      local_60._0_4_ = source;
      cookie.source = session;
      send_remote(ctx,psVar2->fd,msg,sz,(remote_message_header *)local_60);
    }
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

static int
remote_send_handle(struct harbor *h, uint32_t source, uint32_t destination, int type, int session, const char * msg, size_t sz) {
	int harbor_id = destination >> HANDLE_REMOTE_SHIFT;
	struct skynet_context * context = h->ctx;
	if (harbor_id == h->id) {
		// local message
		skynet_send(context, source, destination , type | PTYPE_TAG_DONTCOPY, session, (void *)msg, sz);
		return 1;
	}

	struct slave * s = &h->s[harbor_id];
	if (s->fd == 0 || s->status == STATUS_HANDSHAKE) {
		if (s->status == STATUS_DOWN) {
			// throw an error return to source
			// report the destination is dead
			skynet_send(context, destination, source, PTYPE_ERROR, 0 , NULL, 0);
			skynet_error(context, "Drop message to harbor %d from %x to %x (session = %d, msgsz = %d)",harbor_id, source, destination,session,(int)sz);
		} else {
			if (s->queue == NULL) {
				s->queue = new_queue();
			}
			struct remote_message_header header;
			header.source = source;
			header.destination = (type << HANDLE_REMOTE_SHIFT) | (destination & HANDLE_MASK);
			header.session = (uint32_t)session;
			push_queue(s->queue, (void *)msg, sz, &header);
			return 1;
		}
	} else {
		struct remote_message_header cookie;
		cookie.source = source;
		cookie.destination = (destination & HANDLE_MASK) | ((uint32_t)type << HANDLE_REMOTE_SHIFT);
		cookie.session = (uint32_t)session;
		send_remote(context, s->fd, msg,sz,&cookie);
	}

	return 0;
}